

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void ts_lexer_start(Lexer *self)

{
  uint32_t uVar1;
  
  (self->token_start_position).extent.column = (self->current_position).extent.column;
  uVar1 = (self->current_position).extent.row;
  (self->token_start_position).bytes = (self->current_position).bytes;
  (self->token_start_position).extent.row = uVar1;
  (self->token_end_position).bytes = 0;
  (self->token_end_position).extent.row = 0;
  (self->token_end_position).extent.column = 1;
  (self->data).result_symbol = 0;
  if (self->chunk == (char *)0x0) {
    ts_lexer__get_chunk(self);
  }
  if (self->lookahead_size != 0) {
    return;
  }
  ts_lexer__get_lookahead(self);
  return;
}

Assistant:

void ts_lexer_start(Lexer *self) {
  self->token_start_position = self->current_position;
  self->token_end_position = LENGTH_UNDEFINED;
  self->data.result_symbol = 0;
  if (!self->chunk) ts_lexer__get_chunk(self);
  if (!self->lookahead_size) ts_lexer__get_lookahead(self);
}